

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SetElementI<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout,PropertyOperationFlags flags)

{
  ImplicitCallFlags flags_00;
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  Var aValue;
  Var varIndex_00;
  Var value_00;
  JavascriptArray *array;
  Var value;
  Var varIndex;
  Var instance;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  PropertyOperationFlags flags_local;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar2 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar2);
  flags_00 = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  aValue = GetReg<unsigned_char>
                     (this,(playout->
                           super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                           Instance);
  varIndex_00 = GetReg<unsigned_char>
                          (this,(playout->
                                super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                                Element);
  value_00 = GetReg<unsigned_char>
                       (this,(playout->
                             super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                             Value);
  bVar1 = TaggedNumber::Is(aValue);
  if ((!bVar1) && (bVar1 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(aValue), bVar1)) {
    pSVar2 = GetScriptContext(this);
    bVar1 = Js::JavascriptOperators::SetElementMayHaveImplicitCalls(pSVar2);
    if (!bVar1) {
      array = UnsafeVarTo<Js::JavascriptArray>(aValue);
      pSVar2 = GetScriptContext(this);
      ProfilingHelpers::ProfiledStElem_FastPath
                (array,varIndex_00,value_00,pSVar2,flags,(StElemInfo *)0x0);
      goto LAB_00f3cf41;
    }
  }
  pSVar2 = GetScriptContext(this);
  Js::JavascriptOperators::OP_SetElementI(aValue,varIndex_00,value_00,pSVar2,flags);
LAB_00f3cf41:
  ClearFlags(this,0x10);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetElementI(const unaligned T* playout, PropertyOperationFlags flags)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Same fast path as in the backend.

        Var instance = GetReg(playout->Instance);
        const Var varIndex = GetReg(playout->Element);
        const Var value = GetReg(playout->Value);

#if ENABLE_PROFILE_INFO
        // Only enable fast path if the javascript array is not cross site
        if (!TaggedNumber::Is(instance) &&
            VirtualTableInfo<JavascriptArray>::HasVirtualTable(instance) &&
            !JavascriptOperators::SetElementMayHaveImplicitCalls(GetScriptContext()))
        {
            ProfilingHelpers::ProfiledStElem_FastPath(
                UnsafeVarTo<JavascriptArray>(instance),
                varIndex,
                value,
                GetScriptContext(),
                flags);
        }
        else
#endif
        {
            JavascriptOperators::OP_SetElementI(instance, varIndex, value, GetScriptContext(), flags);
        }

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }